

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O2

void __thiscall serialization::xml_oarchive::save_sequence_start(xml_oarchive *this,size_type size)

{
  memory_pool<char> *this_00;
  xml_node<char> *this_01;
  char *value;
  xml_attribute<char> *attribute;
  string local_48;
  
  this_00 = &(this->document_).super_memory_pool<char>;
  this_01 = rapidxml::memory_pool<char>::allocate_node
                      (this_00,node_element,"sequence",(char *)0x0,0,0);
  std::__cxx11::to_string(&local_48,size);
  value = rapidxml::memory_pool<char>::allocate_string(this_00,local_48._M_dataplus._M_p,0);
  attribute = rapidxml::memory_pool<char>::allocate_attribute(this_00,"size",value,0,0);
  std::__cxx11::string::~string((string *)&local_48);
  rapidxml::xml_node<char>::append_attribute(this_01,attribute);
  rapidxml::xml_node<char>::append_node(this->current_,this_01);
  this->current_ = this_01;
  return;
}

Assistant:

void save_sequence_start(size_type size)
    {
        serialization_trace trace(__func__, "xml");
        auto node = document_.allocate_node(rapidxml::node_element, "sequence");
        auto attr = document_.allocate_attribute("size", document_.allocate_string(std::to_string(size).c_str()));
        node->append_attribute(attr);
        current_->append_node(node);
        current_ = node;
    }